

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O2

void __thiscall MidiOutAlsa::openVirtualPort(MidiOutAlsa *this,string *portName)

{
  string *psVar1;
  undefined8 *puVar2;
  int iVar3;
  string sStack_38;
  
  puVar2 = (undefined8 *)(this->super_MidiOutApi).super_MidiApi.apiData_;
  if (*(int *)((long)puVar2 + 0xc) < 0) {
    iVar3 = snd_seq_create_simple_port(*puVar2,(portName->_M_dataplus)._M_p,0x21,0x100002);
    *(int *)((long)puVar2 + 0xc) = iVar3;
    if (iVar3 < 0) {
      psVar1 = &(this->super_MidiOutApi).super_MidiApi.errorString_;
      std::__cxx11::string::assign((char *)psVar1);
      std::__cxx11::string::string((string *)&sStack_38,(string *)psVar1);
      MidiApi::error((MidiApi *)this,DRIVER_ERROR,&sStack_38);
      std::__cxx11::string::~string((string *)&sStack_38);
    }
  }
  return;
}

Assistant:

void MidiOutAlsa :: openVirtualPort( const std::string &portName )
{
  AlsaMidiData *data = static_cast<AlsaMidiData *> (apiData_);
  if ( data->vport < 0 ) {
    data->vport = snd_seq_create_simple_port( data->seq, portName.c_str(),
                                              SND_SEQ_PORT_CAP_READ|SND_SEQ_PORT_CAP_SUBS_READ,
                                              SND_SEQ_PORT_TYPE_MIDI_GENERIC|SND_SEQ_PORT_TYPE_APPLICATION );

    if ( data->vport < 0 ) {
      errorString_ = "MidiOutAlsa::openVirtualPort: ALSA error creating virtual port.";
      error( RtMidiError::DRIVER_ERROR, errorString_ );
    }
  }
}